

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

lostFraction __thiscall llvm::detail::IEEEFloat::divideSignificand(IEEEFloat *this,IEEEFloat *rhs)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint n;
  uint uVar3;
  int iVar4;
  integerPart *parts;
  integerPart *piVar5;
  ulong uVar6;
  WordType *parts_00;
  int cmp;
  uint precision;
  lostFraction lost_fraction;
  integerPart scratch [4];
  integerPart *divisor;
  integerPart *dividend;
  integerPart *lhsSignificand;
  integerPart *rhsSignificand;
  uint local_20;
  uint partsCount;
  uint i;
  uint bit;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  if (this->semantics != rhs->semantics) {
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x439,
                  "lostFraction llvm::detail::IEEEFloat::divideSignificand(const IEEEFloat &)");
  }
  parts = significandParts(this);
  piVar5 = significandParts(rhs);
  n = partCount(this);
  if (n < 3) {
    divisor = (integerPart *)&precision;
  }
  else {
    auVar1 = ZEXT416(n << 1) * ZEXT816(8);
    uVar6 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    divisor = (integerPart *)operator_new__(uVar6);
  }
  parts_00 = divisor + n;
  for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
    divisor[local_20] = parts[local_20];
    parts_00[local_20] = piVar5[local_20];
    parts[local_20] = 0;
  }
  this->exponent = this->exponent - rhs->exponent;
  partsCount = this->semantics->precision;
  scratch[3] = (integerPart)parts_00;
  uVar3 = APInt::tcMSB(parts_00,n);
  uVar3 = (partsCount - uVar3) - 1;
  if (uVar3 != 0) {
    this->exponent = this->exponent + (short)uVar3;
    APInt::tcShiftLeft((WordType *)scratch[3],n,uVar3);
  }
  uVar3 = APInt::tcMSB(divisor,n);
  uVar3 = (partsCount - uVar3) - 1;
  if (uVar3 != 0) {
    this->exponent = this->exponent - (short)uVar3;
    APInt::tcShiftLeft(divisor,n,uVar3);
  }
  iVar4 = APInt::tcCompare(divisor,(WordType *)scratch[3],n);
  if (iVar4 < 0) {
    this->exponent = this->exponent + -1;
    APInt::tcShiftLeft(divisor,n,1);
    iVar4 = APInt::tcCompare(divisor,(WordType *)scratch[3],n);
    if (iVar4 < 0) {
      __assert_fail("APInt::tcCompare(dividend, divisor, partsCount) >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x465,
                    "lostFraction llvm::detail::IEEEFloat::divideSignificand(const IEEEFloat &)");
    }
  }
  for (; partsCount != 0; partsCount = partsCount - 1) {
    iVar4 = APInt::tcCompare(divisor,(WordType *)scratch[3],n);
    if (-1 < iVar4) {
      APInt::tcSubtract(divisor,(WordType *)scratch[3],0,n);
      APInt::tcSetBit(parts,partsCount - 1);
    }
    APInt::tcShiftLeft(divisor,n,1);
  }
  iVar4 = APInt::tcCompare(divisor,(WordType *)scratch[3],n);
  if (iVar4 < 1) {
    if (iVar4 == 0) {
      cmp = 2;
    }
    else {
      bVar2 = APInt::tcIsZero(divisor,n);
      cmp = (int)!bVar2;
    }
  }
  else {
    cmp = 3;
  }
  if ((2 < n) && (divisor != (integerPart *)0x0)) {
    operator_delete__(divisor);
  }
  return cmp;
}

Assistant:

lostFraction IEEEFloat::divideSignificand(const IEEEFloat &rhs) {
  unsigned int bit, i, partsCount;
  const integerPart *rhsSignificand;
  integerPart *lhsSignificand, *dividend, *divisor;
  integerPart scratch[4];
  lostFraction lost_fraction;

  assert(semantics == rhs.semantics);

  lhsSignificand = significandParts();
  rhsSignificand = rhs.significandParts();
  partsCount = partCount();

  if (partsCount > 2)
    dividend = new integerPart[partsCount * 2];
  else
    dividend = scratch;

  divisor = dividend + partsCount;

  /* Copy the dividend and divisor as they will be modified in-place.  */
  for (i = 0; i < partsCount; i++) {
    dividend[i] = lhsSignificand[i];
    divisor[i] = rhsSignificand[i];
    lhsSignificand[i] = 0;
  }

  exponent -= rhs.exponent;

  unsigned int precision = semantics->precision;

  /* Normalize the divisor.  */
  bit = precision - APInt::tcMSB(divisor, partsCount) - 1;
  if (bit) {
    exponent += bit;
    APInt::tcShiftLeft(divisor, partsCount, bit);
  }

  /* Normalize the dividend.  */
  bit = precision - APInt::tcMSB(dividend, partsCount) - 1;
  if (bit) {
    exponent -= bit;
    APInt::tcShiftLeft(dividend, partsCount, bit);
  }

  /* Ensure the dividend >= divisor initially for the loop below.
     Incidentally, this means that the division loop below is
     guaranteed to set the integer bit to one.  */
  if (APInt::tcCompare(dividend, divisor, partsCount) < 0) {
    exponent--;
    APInt::tcShiftLeft(dividend, partsCount, 1);
    assert(APInt::tcCompare(dividend, divisor, partsCount) >= 0);
  }

  /* Long division.  */
  for (bit = precision; bit; bit -= 1) {
    if (APInt::tcCompare(dividend, divisor, partsCount) >= 0) {
      APInt::tcSubtract(dividend, divisor, 0, partsCount);
      APInt::tcSetBit(lhsSignificand, bit - 1);
    }

    APInt::tcShiftLeft(dividend, partsCount, 1);
  }

  /* Figure out the lost fraction.  */
  int cmp = APInt::tcCompare(dividend, divisor, partsCount);

  if (cmp > 0)
    lost_fraction = lfMoreThanHalf;
  else if (cmp == 0)
    lost_fraction = lfExactlyHalf;
  else if (APInt::tcIsZero(dividend, partsCount))
    lost_fraction = lfExactlyZero;
  else
    lost_fraction = lfLessThanHalf;

  if (partsCount > 2)
    delete [] dividend;

  return lost_fraction;
}